

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

Expression * __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>
::replaceCurrent(Walker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>
                 *this,Expression *expression)

{
  if (this->currFunction != (Function *)0x0) {
    debuginfo::copyOriginalToReplacement(*this->replacep,expression,this->currFunction);
  }
  *this->replacep = expression;
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      debuginfo::copyOriginalToReplacement(
        getCurrent(), expression, currFunction);
    }
    return *replacep = expression;
  }